

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O2

void __thiscall booster::locale::calendar::calendar(calendar *this,ios_base *ios)

{
  ios_info *this_00;
  calendar_facet *pcVar1;
  abstract_calendar *paVar2;
  
  std::locale::locale(&this->locale_,(locale *)(ios + 0xd0));
  this_00 = ios_info::get(ios);
  ios_info::time_zone_abi_cxx11_(&this->tz_,this_00);
  pcVar1 = std::use_facet<booster::locale::calendar_facet>(&this->locale_);
  paVar2 = (abstract_calendar *)(**(code **)(*(long *)pcVar1 + 0x10))(pcVar1);
  (this->impl_).ptr_ = paVar2;
  (*paVar2->_vptr_abstract_calendar[10])(paVar2,&this->tz_);
  return;
}

Assistant:

calendar::calendar(std::ios_base &ios) :
    locale_(ios.getloc()),
    tz_(ios_info::get(ios).time_zone()),
    impl_(std::use_facet<calendar_facet>(locale_).create_calendar())
{
    impl_->set_timezone(tz_);
    
}